

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicLattice.cpp
# Opt level: O2

void __thiscall RhombicLattice::createFaces(RhombicLattice *this)

{
  Lattice *this_00;
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  int vertexIndex;
  double dVar8;
  cartesian4 cVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<int> __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<int> __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<int> __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<int> __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<int> __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<int> __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<int> __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<int> __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<int> __l_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_17;
  initializer_list<int> __l_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_19;
  initializer_list<int> __l_20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_21;
  initializer_list<int> __l_22;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_23;
  initializer_list<int> __l_24;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_25;
  initializer_list<int> __l_26;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_27;
  initializer_list<int> __l_28;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_29;
  initializer_list<int> __l_30;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_31;
  initializer_list<int> __l_32;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_33;
  initializer_list<int> __l_34;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_35;
  initializer_list<int> __l_36;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_37;
  initializer_list<int> __l_38;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_39;
  initializer_list<int> __l_40;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_41;
  initializer_list<int> __l_42;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_43;
  initializer_list<int> __l_44;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_45;
  initializer_list<int> __l_46;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_47;
  initializer_list<int> __l_48;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_49;
  initializer_list<int> __l_50;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_51;
  initializer_list<int> __l_52;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_53;
  initializer_list<int> __l_54;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_55;
  initializer_list<int> __l_56;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_57;
  initializer_list<int> __l_58;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_59;
  initializer_list<int> __l_60;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_61;
  initializer_list<int> __l_62;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_63;
  initializer_list<int> __l_64;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_65;
  initializer_list<int> __l_66;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_67;
  initializer_list<int> __l_68;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_69;
  initializer_list<int> __l_70;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_71;
  initializer_list<int> __l_72;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_73;
  initializer_list<int> __l_74;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_75;
  initializer_list<int> __l_76;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_77;
  initializer_list<int> __l_78;
  allocator_type local_25d;
  allocator local_25c;
  allocator local_25b;
  allocator local_25a;
  allocator_type local_259;
  ulong local_258;
  Lattice *local_250;
  int local_248 [6];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230;
  allocator local_211;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  _Vector_base<int,_std::allocator<int>_> local_190;
  string *local_178;
  string *local_170;
  string *local_168;
  string *local_160;
  string *local_158;
  string *local_150;
  string *local_148;
  string *local_140;
  string *local_138;
  string *local_130;
  string *local_128;
  string *local_120;
  string *local_118;
  string *local_110;
  string *local_108;
  string *local_100;
  string *local_f8;
  string *local_f0;
  string *local_e8;
  string *local_e0;
  string *local_d8;
  string *local_d0;
  string *local_c8;
  string *local_c0;
  string *local_b8;
  string *local_b0;
  string *local_a8;
  string *local_a0;
  string *local_98;
  string *local_90;
  string *local_88;
  string *local_80;
  string *local_78;
  string *local_70;
  string *local_68;
  string *local_60;
  string *local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  double local_38;
  
  local_178 = local_1f0;
  vertexIndex = 0;
  local_258 = 0;
  local_250 = &this->super_Lattice;
  local_170 = local_178;
  local_168 = local_178;
  local_160 = local_178;
  local_158 = local_178;
  local_150 = local_178;
  local_148 = local_178;
  local_140 = local_178;
  local_138 = local_178;
  local_130 = local_178;
  local_128 = local_178;
  local_120 = local_178;
  local_118 = local_178;
  local_110 = local_178;
  local_108 = local_178;
  local_100 = local_178;
  local_f8 = local_178;
  local_f0 = local_178;
  local_e8 = local_178;
  local_e0 = local_178;
  local_d8 = local_178;
  local_d0 = local_178;
  local_c8 = local_178;
  local_c0 = local_178;
  local_b8 = local_178;
  local_b0 = local_178;
  local_a8 = local_178;
  local_a0 = local_178;
  local_98 = local_178;
  local_90 = local_178;
  local_88 = local_178;
  local_80 = local_178;
  local_78 = local_178;
  local_70 = local_178;
  local_68 = local_178;
  local_60 = local_178;
  local_58 = local_178;
  local_50 = local_178;
  local_48 = local_178;
  local_40 = local_178;
  do {
    this_00 = local_250;
    local_38 = (double)vertexIndex;
    dVar8 = pow((double)local_250->l,3.0);
    if (dVar8 <= local_38) {
      return;
    }
    cVar9 = Lattice::indexToCoordinate(this_00,vertexIndex);
    uVar1 = cVar9._0_8_;
    uVar3 = cVar9.z;
    if (uVar3 != 0) {
      uVar6 = cVar9.x;
      uVar2 = cVar9.y;
      if ((uVar3 + uVar6 + uVar2 & 0x80000001) == 1) {
        if ((uVar3 & 0x80000001) == 1) {
          if (uVar1 >> 0x20 == 0) {
            std::__cxx11::string::string((string *)&local_210,"xyz",&local_25a);
            std::__cxx11::string::string(local_1f0,"xy",&local_211);
            std::__cxx11::string::string(local_1d0,"xy",&local_25b);
            std::__cxx11::string::string(local_1b0,"xyz",&local_25c);
            __l._M_len = 4;
            __l._M_array = &local_210;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_230,__l,&local_259);
            local_248[0] = 1;
            local_248[1] = 1;
            local_248[2] = 1;
            local_248[3] = 1;
            __l_00._M_len = 4;
            __l_00._M_array = local_248;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_190,__l_00,&local_25d);
            Lattice::addFace(local_250,vertexIndex,(int)local_258,&local_230,(vint *)&local_190);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_230);
            lVar5 = 0x60;
            do {
              std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5));
              lVar5 = lVar5 + -0x20;
            } while (lVar5 != -0x20);
            local_258 = (ulong)((int)local_258 + 1);
          }
          else if (uVar6 == 0) {
            std::__cxx11::string::string((string *)&local_210,"xyz",&local_25a);
            std::__cxx11::string::string(local_1f0,"xy",&local_211);
            std::__cxx11::string::string(local_1d0,"xy",&local_25b);
            std::__cxx11::string::string(local_1b0,"xyz",&local_25c);
            __l_17._M_len = 4;
            __l_17._M_array = &local_210;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_230,__l_17,&local_259);
            local_248[0] = 1;
            local_248[1] = 1;
            local_248[2] = 1;
            local_248[3] = 1;
            __l_18._M_len = 4;
            __l_18._M_array = local_248;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_190,__l_18,&local_25d);
            Lattice::addFace(local_250,vertexIndex,(int)local_258,&local_230,(vint *)&local_190);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_230);
            lVar5 = 0x60;
            do {
              std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5));
              lVar5 = lVar5 + -0x20;
            } while (lVar5 != -0x20);
            uVar6 = (int)local_258 + 1;
            if (local_250->l - 1U != uVar3) {
              std::__cxx11::string::string((string *)&local_210,"xyz",&local_25a);
              std::__cxx11::string::string(local_1f0,"xz",&local_211);
              std::__cxx11::string::string(local_1d0,"xz",&local_25b);
              std::__cxx11::string::string(local_1b0,"xyz",&local_25c);
              __l_27._M_len = 4;
              __l_27._M_array = &local_210;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_230,__l_27,&local_259);
              local_248[0] = 1;
              local_248[1] = 1;
              local_248[2] = 1;
              local_248[3] = 1;
              __l_28._M_len = 4;
              __l_28._M_array = local_248;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_190,__l_28,&local_25d);
              Lattice::addFace(local_250,vertexIndex,uVar6,&local_230,(vint *)&local_190);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_230);
              lVar5 = 0x60;
              do {
                std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5))
                ;
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != -0x20);
              uVar6 = (int)local_258 + 2;
            }
            if (uVar3 != 1) {
              std::__cxx11::string::string((string *)&local_210,"xy",&local_25a);
              std::__cxx11::string::string(local_1f0,"yz",&local_211);
              std::__cxx11::string::string(local_1d0,"yz",&local_25b);
              std::__cxx11::string::string(local_1b0,"xy",&local_25c);
              __l_29._M_len = 4;
              __l_29._M_array = &local_210;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_230,__l_29,&local_259);
              local_248[0] = 1;
              local_248[1] = -1;
              local_248[2] = -1;
              local_248[3] = 1;
              __l_30._M_len = 4;
              __l_30._M_array = local_248;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_190,__l_30,&local_25d);
              Lattice::addFace(local_250,vertexIndex,uVar6,&local_230,(vint *)&local_190);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_230);
              lVar5 = 0x60;
              do {
                std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5))
                ;
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != -0x20);
              goto LAB_001232fa;
            }
LAB_001236cc:
            local_258 = (ulong)uVar6;
          }
          else {
            uVar7 = local_250->l - 1;
            if (uVar7 == uVar6) {
              if (uVar6 != uVar2) {
                std::__cxx11::string::string((string *)&local_210,"yz",&local_25a);
                std::__cxx11::string::string(local_1f0,"xz",&local_211);
                std::__cxx11::string::string(local_1d0,"xz",&local_25b);
                std::__cxx11::string::string(local_1b0,"yz",&local_25c);
                __l_07._M_len = 4;
                __l_07._M_array = &local_210;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_230,__l_07,&local_259);
                local_248[0] = 1;
                local_248[1] = -1;
                local_248[2] = -1;
                local_248[3] = 1;
                __l_08._M_len = 4;
                __l_08._M_array = local_248;
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)&local_190,__l_08,&local_25d);
                Lattice::addFace(local_250,vertexIndex,(int)local_258,&local_230,(vint *)&local_190)
                ;
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_230);
                lVar5 = 0x60;
                do {
                  std::__cxx11::string::~string
                            ((string *)((long)&local_210._M_dataplus._M_p + lVar5));
                  lVar5 = lVar5 + -0x20;
                } while (lVar5 != -0x20);
                uVar6 = (int)local_258 + 1;
                if (local_250->l - 1U != uVar3) {
                  std::__cxx11::string::string((string *)&local_210,"xy",&local_25a);
                  std::__cxx11::string::string(local_1f0,"yz",&local_211);
                  std::__cxx11::string::string(local_1d0,"yz",&local_25b);
                  std::__cxx11::string::string(local_1b0,"xy",&local_25c);
                  __l_09._M_len = 4;
                  __l_09._M_array = &local_210;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_230,__l_09,&local_259);
                  local_248[0] = -1;
                  local_248[1] = 1;
                  local_248[2] = 1;
                  local_248[3] = -1;
                  __l_10._M_len = 4;
                  __l_10._M_array = local_248;
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)&local_190,__l_10,&local_25d);
                  Lattice::addFace(local_250,vertexIndex,uVar6,&local_230,(vint *)&local_190);
                  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_230);
                  lVar5 = 0x60;
                  do {
                    std::__cxx11::string::~string
                              ((string *)((long)&local_210._M_dataplus._M_p + lVar5));
                    lVar5 = lVar5 + -0x20;
                  } while (lVar5 != -0x20);
                  uVar6 = (int)local_258 + 2;
                }
                if (uVar3 == 1) goto LAB_001236cc;
                std::__cxx11::string::string((string *)&local_210,"xyz",&local_25a);
                std::__cxx11::string::string(local_1f0,"xz",&local_211);
                std::__cxx11::string::string(local_1d0,"xz",&local_25b);
                std::__cxx11::string::string(local_1b0,"xyz",&local_25c);
                __l_11._M_len = 4;
                __l_11._M_array = &local_210;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_230,__l_11,&local_259);
                local_248[0] = -1;
                local_248[1] = -1;
                local_248[2] = -1;
                local_248[3] = -1;
                __l_12._M_len = 4;
                __l_12._M_array = local_248;
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)&local_190,__l_12,&local_25d);
                Lattice::addFace(local_250,vertexIndex,uVar6,&local_230,(vint *)&local_190);
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_230);
                lVar5 = 0x60;
                do {
                  std::__cxx11::string::~string
                            ((string *)((long)&local_210._M_dataplus._M_p + lVar5));
                  lVar5 = lVar5 + -0x20;
                } while (lVar5 != -0x20);
                goto LAB_001232fa;
              }
            }
            else {
              if (uVar7 == uVar2) {
                std::__cxx11::string::string((string *)&local_210,"xz",&local_25a);
                std::__cxx11::string::string(local_1f0,"yz",&local_211);
                std::__cxx11::string::string(local_1d0,"yz",&local_25b);
                std::__cxx11::string::string(local_1b0,"xz",&local_25c);
                __l_19._M_len = 4;
                __l_19._M_array = &local_210;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_230,__l_19,&local_259);
                local_248[0] = 1;
                local_248[1] = -1;
                local_248[2] = -1;
                local_248[3] = 1;
                __l_20._M_len = 4;
                __l_20._M_array = local_248;
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)&local_190,__l_20,&local_25d);
                Lattice::addFace(local_250,vertexIndex,(int)local_258,&local_230,(vint *)&local_190)
                ;
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_230);
                lVar5 = 0x60;
                do {
                  std::__cxx11::string::~string
                            ((string *)((long)&local_210._M_dataplus._M_p + lVar5));
                  lVar5 = lVar5 + -0x20;
                } while (lVar5 != -0x20);
                goto LAB_001232f3;
              }
              iVar4 = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) %
                           2);
              if (((undefined1  [16])cVar9 & (undefined1  [16])0x100000000) == (undefined1  [16])0x0
                  && iVar4 == 0) {
                if (uVar7 != uVar3) {
                  std::__cxx11::string::string((string *)&local_210,"xyz",&local_25a);
                  std::__cxx11::string::string(local_1f0,"xz",&local_211);
                  std::__cxx11::string::string(local_1d0,"xz",&local_25b);
                  std::__cxx11::string::string(local_1b0,"xyz",&local_25c);
                  __l_67._M_len = 4;
                  __l_67._M_array = &local_210;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_230,__l_67,&local_259);
                  local_248[0] = 1;
                  local_248[1] = 1;
                  local_248[2] = 1;
                  local_248[3] = 1;
                  __l_68._M_len = 4;
                  __l_68._M_array = local_248;
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)&local_190,__l_68,&local_25d);
                  Lattice::addFace(local_250,vertexIndex,(int)local_258,&local_230,
                                   (vint *)&local_190);
                  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_230);
                  lVar5 = 0x60;
                  do {
                    std::__cxx11::string::~string
                              ((string *)((long)&local_210._M_dataplus._M_p + lVar5));
                    lVar5 = lVar5 + -0x20;
                  } while (lVar5 != -0x20);
                  std::__cxx11::string::string((string *)&local_210,"xy",&local_25a);
                  std::__cxx11::string::string(local_1f0,"yz",&local_211);
                  std::__cxx11::string::string(local_1d0,"yz",&local_25b);
                  std::__cxx11::string::string(local_1b0,"xy",&local_25c);
                  __l_69._M_len = 4;
                  __l_69._M_array = &local_210;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_230,__l_69,&local_259);
                  local_248[0] = -1;
                  local_248[1] = 1;
                  local_248[2] = 1;
                  local_248[3] = -1;
                  __l_70._M_len = 4;
                  __l_70._M_array = local_248;
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)&local_190,__l_70,&local_25d);
                  Lattice::addFace(local_250,vertexIndex,(int)local_258 + 1,&local_230,
                                   (vint *)&local_190);
                  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_230);
                  lVar5 = 0x60;
                  do {
                    std::__cxx11::string::~string
                              ((string *)((long)&local_210._M_dataplus._M_p + lVar5));
                    lVar5 = lVar5 + -0x20;
                  } while (lVar5 != -0x20);
                  local_258 = (ulong)((int)local_258 + 2);
                }
                if (uVar3 != 1) {
                  std::__cxx11::string::string((string *)&local_210,"xy",&local_25a);
                  std::__cxx11::string::string(local_1f0,"yz",&local_211);
                  std::__cxx11::string::string(local_1d0,"yz",&local_25b);
                  std::__cxx11::string::string(local_1b0,"xy",&local_25c);
                  __l_71._M_len = 4;
                  __l_71._M_array = &local_210;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_230,__l_71,&local_259);
                  local_248[0] = 1;
                  local_248[1] = -1;
                  local_248[2] = -1;
                  local_248[3] = 1;
                  __l_72._M_len = 4;
                  __l_72._M_array = local_248;
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)&local_190,__l_72,&local_25d);
                  Lattice::addFace(local_250,vertexIndex,(int)local_258,&local_230,
                                   (vint *)&local_190);
                  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_230);
                  lVar5 = 0x60;
                  do {
                    std::__cxx11::string::~string
                              ((string *)((long)&local_210._M_dataplus._M_p + lVar5));
                    lVar5 = lVar5 + -0x20;
                  } while (lVar5 != -0x20);
                  std::__cxx11::string::string((string *)&local_210,"xyz",&local_25a);
                  std::__cxx11::string::string(local_1f0,"xz",&local_211);
                  std::__cxx11::string::string(local_1d0,"xz",&local_25b);
                  std::__cxx11::string::string(local_1b0,"xyz",&local_25c);
                  __l_73._M_len = 4;
                  __l_73._M_array = &local_210;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_230,__l_73,&local_259);
                  local_248[0] = -1;
                  local_248[1] = -1;
                  local_248[2] = -1;
                  local_248[3] = -1;
                  __l_74._M_len = 4;
                  __l_74._M_array = local_248;
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)&local_190,__l_74,&local_25d);
                  Lattice::addFace(local_250,vertexIndex,(int)local_258 + 1,&local_230,
                                   (vint *)&local_190);
                  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_230);
                  lVar5 = 0x60;
                  do {
                    std::__cxx11::string::~string
                              ((string *)((long)&local_210._M_dataplus._M_p + lVar5));
                    lVar5 = lVar5 + -0x20;
                  } while (lVar5 != -0x20);
                  local_258 = (ulong)((int)local_258 + 2);
                }
                std::__cxx11::string::string((string *)&local_210,"xyz",&local_25a);
                std::__cxx11::string::string(local_1f0,"xy",&local_211);
                std::__cxx11::string::string(local_1d0,"xy",&local_25b);
                std::__cxx11::string::string(local_1b0,"xyz",&local_25c);
                __l_75._M_len = 4;
                __l_75._M_array = &local_210;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_230,__l_75,&local_259);
                local_248[0] = 1;
                local_248[1] = 1;
                local_248[2] = 1;
                local_248[3] = 1;
                __l_76._M_len = 4;
                __l_76._M_array = local_248;
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)&local_190,__l_76,&local_25d);
                Lattice::addFace(local_250,vertexIndex,(int)local_258,&local_230,(vint *)&local_190)
                ;
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_230);
                lVar5 = 0x60;
                do {
                  std::__cxx11::string::~string
                            ((string *)((long)&local_210._M_dataplus._M_p + lVar5));
                  lVar5 = lVar5 + -0x20;
                } while (lVar5 != -0x20);
                std::__cxx11::string::string((string *)&local_210,"xyz",&local_25a);
                std::__cxx11::string::string(local_1f0,"xy",&local_211);
                std::__cxx11::string::string(local_1d0,"xy",&local_25b);
                std::__cxx11::string::string(local_1b0,"xyz",&local_25c);
                __l_77._M_len = 4;
                __l_77._M_array = &local_210;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_230,__l_77,&local_259);
                local_248[0] = -1;
                local_248[1] = -1;
                local_248[2] = -1;
                local_248[3] = -1;
                __l_78._M_len = 4;
                __l_78._M_array = local_248;
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)&local_190,__l_78,&local_25d);
                Lattice::addFace(local_250,vertexIndex,(int)local_258 + 1,&local_230,
                                 (vint *)&local_190);
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_230);
                lVar5 = 0x60;
                do {
                  std::__cxx11::string::~string
                            ((string *)((long)&local_210._M_dataplus._M_p + lVar5));
                  lVar5 = lVar5 + -0x20;
                } while (lVar5 != -0x20);
              }
              else {
                if ((uVar2 & 0x80000001) != 1 || iVar4 != 1) goto LAB_00124e65;
                if (uVar7 != uVar3) {
                  std::__cxx11::string::string((string *)&local_210,"xyz",&local_25a);
                  std::__cxx11::string::string(local_1f0,"xz",&local_211);
                  std::__cxx11::string::string(local_1d0,"xz",&local_25b);
                  std::__cxx11::string::string(local_1b0,"xyz",&local_25c);
                  __l_31._M_len = 4;
                  __l_31._M_array = &local_210;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_230,__l_31,&local_259);
                  local_248[0] = 1;
                  local_248[1] = 1;
                  local_248[2] = 1;
                  local_248[3] = 1;
                  __l_32._M_len = 4;
                  __l_32._M_array = local_248;
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)&local_190,__l_32,&local_25d);
                  Lattice::addFace(local_250,vertexIndex,(int)local_258,&local_230,
                                   (vint *)&local_190);
                  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_230);
                  lVar5 = 0x60;
                  do {
                    std::__cxx11::string::~string
                              ((string *)((long)&local_210._M_dataplus._M_p + lVar5));
                    lVar5 = lVar5 + -0x20;
                  } while (lVar5 != -0x20);
                  std::__cxx11::string::string((string *)&local_210,"xy",&local_25a);
                  std::__cxx11::string::string(local_1f0,"yz",&local_211);
                  std::__cxx11::string::string(local_1d0,"yz",&local_25b);
                  std::__cxx11::string::string(local_1b0,"xy",&local_25c);
                  __l_33._M_len = 4;
                  __l_33._M_array = &local_210;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_230,__l_33,&local_259);
                  local_248[0] = -1;
                  local_248[1] = 1;
                  local_248[2] = 1;
                  local_248[3] = -1;
                  __l_34._M_len = 4;
                  __l_34._M_array = local_248;
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)&local_190,__l_34,&local_25d);
                  Lattice::addFace(local_250,vertexIndex,(int)local_258 + 1,&local_230,
                                   (vint *)&local_190);
                  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_230);
                  lVar5 = 0x60;
                  do {
                    std::__cxx11::string::~string
                              ((string *)((long)&local_210._M_dataplus._M_p + lVar5));
                    lVar5 = lVar5 + -0x20;
                  } while (lVar5 != -0x20);
                  local_258 = (ulong)((int)local_258 + 2);
                }
                if (uVar3 != 1) {
                  std::__cxx11::string::string((string *)&local_210,"xy",&local_25a);
                  std::__cxx11::string::string(local_1f0,"yz",&local_211);
                  std::__cxx11::string::string(local_1d0,"yz",&local_25b);
                  std::__cxx11::string::string(local_1b0,"xy",&local_25c);
                  __l_35._M_len = 4;
                  __l_35._M_array = &local_210;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_230,__l_35,&local_259);
                  local_248[0] = 1;
                  local_248[1] = -1;
                  local_248[2] = -1;
                  local_248[3] = 1;
                  __l_36._M_len = 4;
                  __l_36._M_array = local_248;
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)&local_190,__l_36,&local_25d);
                  Lattice::addFace(local_250,vertexIndex,(int)local_258,&local_230,
                                   (vint *)&local_190);
                  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_230);
                  lVar5 = 0x60;
                  do {
                    std::__cxx11::string::~string
                              ((string *)((long)&local_210._M_dataplus._M_p + lVar5));
                    lVar5 = lVar5 + -0x20;
                  } while (lVar5 != -0x20);
                  std::__cxx11::string::string((string *)&local_210,"xyz",&local_25a);
                  std::__cxx11::string::string(local_1f0,"xz",&local_211);
                  std::__cxx11::string::string(local_1d0,"xz",&local_25b);
                  std::__cxx11::string::string(local_1b0,"xyz",&local_25c);
                  __l_37._M_len = 4;
                  __l_37._M_array = &local_210;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_230,__l_37,&local_259);
                  local_248[0] = -1;
                  local_248[1] = -1;
                  local_248[2] = -1;
                  local_248[3] = -1;
                  __l_38._M_len = 4;
                  __l_38._M_array = local_248;
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)&local_190,__l_38,&local_25d);
                  Lattice::addFace(local_250,vertexIndex,(int)local_258 + 1,&local_230,
                                   (vint *)&local_190);
                  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_230);
                  lVar5 = 0x60;
                  do {
                    std::__cxx11::string::~string
                              ((string *)((long)&local_210._M_dataplus._M_p + lVar5));
                    lVar5 = lVar5 + -0x20;
                  } while (lVar5 != -0x20);
                  local_258 = (ulong)((int)local_258 + 2);
                }
                std::__cxx11::string::string((string *)&local_210,"xz",&local_25a);
                std::__cxx11::string::string(local_1f0,"yz",&local_211);
                std::__cxx11::string::string(local_1d0,"yz",&local_25b);
                std::__cxx11::string::string(local_1b0,"xz",&local_25c);
                __l_39._M_len = 4;
                __l_39._M_array = &local_210;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_230,__l_39,&local_259);
                local_248[0] = 1;
                local_248[1] = -1;
                local_248[2] = -1;
                local_248[3] = 1;
                __l_40._M_len = 4;
                __l_40._M_array = local_248;
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)&local_190,__l_40,&local_25d);
                Lattice::addFace(local_250,vertexIndex,(int)local_258,&local_230,(vint *)&local_190)
                ;
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_230);
                lVar5 = 0x60;
                do {
                  std::__cxx11::string::~string
                            ((string *)((long)&local_210._M_dataplus._M_p + lVar5));
                  lVar5 = lVar5 + -0x20;
                } while (lVar5 != -0x20);
                std::__cxx11::string::string((string *)&local_210,"xz",&local_25a);
                std::__cxx11::string::string(local_1f0,"yz",&local_211);
                std::__cxx11::string::string(local_1d0,"yz",&local_25b);
                std::__cxx11::string::string(local_1b0,"xz",&local_25c);
                __l_41._M_len = 4;
                __l_41._M_array = &local_210;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_230,__l_41,&local_259);
                local_248[0] = -1;
                local_248[1] = 1;
                local_248[2] = 1;
                local_248[3] = -1;
                __l_42._M_len = 4;
                __l_42._M_array = local_248;
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)&local_190,__l_42,&local_25d);
                Lattice::addFace(local_250,vertexIndex,(int)local_258 + 1,&local_230,
                                 (vint *)&local_190);
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_230);
                lVar5 = 0x60;
                do {
                  std::__cxx11::string::~string
                            ((string *)((long)&local_210._M_dataplus._M_p + lVar5));
                  lVar5 = lVar5 + -0x20;
                } while (lVar5 != -0x20);
              }
              local_258 = (ulong)((int)local_258 + 2);
            }
          }
        }
        else if (uVar6 == 0) {
          std::__cxx11::string::string((string *)&local_210,"xz",&local_25a);
          std::__cxx11::string::string(local_1f0,"yz",&local_211);
          std::__cxx11::string::string(local_1d0,"yz",&local_25b);
          std::__cxx11::string::string(local_1b0,"xz",&local_25c);
          __l_13._M_len = 4;
          __l_13._M_array = &local_210;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_230,__l_13,&local_259);
          local_248[0] = 1;
          local_248[1] = -1;
          local_248[2] = -1;
          local_248[3] = 1;
          __l_14._M_len = 4;
          __l_14._M_array = local_248;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&local_190,__l_14,&local_25d);
          Lattice::addFace(local_250,vertexIndex,(int)local_258,&local_230,(vint *)&local_190);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_230);
          lVar5 = 0x60;
          do {
            std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5));
            lVar5 = lVar5 + -0x20;
          } while (lVar5 != -0x20);
LAB_001232f3:
          uVar6 = (uint)local_258;
LAB_001232fa:
          local_258 = (ulong)(uVar6 + 1);
        }
        else {
          uVar3 = local_250->l - 1;
          if (uVar1 >> 0x20 == 0) {
            if (uVar3 != uVar6) {
              std::__cxx11::string::string((string *)&local_210,"xyz",&local_25a);
              std::__cxx11::string::string(local_1f0,"xy",&local_211);
              std::__cxx11::string::string(local_1d0,"xy",&local_25b);
              std::__cxx11::string::string(local_1b0,"xyz",&local_25c);
              __l_01._M_len = 4;
              __l_01._M_array = &local_210;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_230,__l_01,&local_259);
              local_248[0] = 1;
              local_248[1] = 1;
              local_248[2] = 1;
              local_248[3] = 1;
              __l_02._M_len = 4;
              __l_02._M_array = local_248;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_190,__l_02,&local_25d);
              Lattice::addFace(local_250,vertexIndex,(int)local_258,&local_230,(vint *)&local_190);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_230);
              lVar5 = 0x60;
              do {
                std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5))
                ;
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != -0x20);
              std::__cxx11::string::string((string *)&local_210,"xyz",&local_25a);
              std::__cxx11::string::string(local_1f0,"yz",&local_211);
              std::__cxx11::string::string(local_1d0,"yz",&local_25b);
              std::__cxx11::string::string(local_1b0,"xyz",&local_25c);
              __l_03._M_len = 4;
              __l_03._M_array = &local_210;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_230,__l_03,&local_259);
              local_248[0] = 1;
              local_248[1] = 1;
              local_248[2] = 1;
              local_248[3] = 1;
              __l_04._M_len = 4;
              __l_04._M_array = local_248;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_190,__l_04,&local_25d);
              Lattice::addFace(local_250,vertexIndex,(int)local_258 + 1,&local_230,
                               (vint *)&local_190);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_230);
              lVar5 = 0x60;
              do {
                std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5))
                ;
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != -0x20);
              std::__cxx11::string::string((string *)&local_210,"xy",&local_25a);
              std::__cxx11::string::string(local_1f0,"xz",&local_211);
              std::__cxx11::string::string(local_1d0,"xz",&local_25b);
              std::__cxx11::string::string(local_1b0,"xy",&local_25c);
              __l_05._M_len = 4;
              __l_05._M_array = &local_210;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_230,__l_05,&local_259);
              local_248[0] = 1;
              local_248[1] = -1;
              local_248[2] = -1;
              local_248[3] = 1;
              __l_06._M_len = 4;
              __l_06._M_array = local_248;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_190,__l_06,&local_25d);
              Lattice::addFace(local_250,vertexIndex,(int)local_258 + 2,&local_230,
                               (vint *)&local_190);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_230);
              lVar5 = 0x60;
              do {
                std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5))
                ;
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != -0x20);
LAB_001235c6:
              local_258 = (ulong)((int)local_258 + 3);
            }
          }
          else {
            if (uVar3 == uVar6) {
              std::__cxx11::string::string((string *)&local_210,"xyz",&local_25a);
              std::__cxx11::string::string(local_1f0,"xy",&local_211);
              std::__cxx11::string::string(local_1d0,"xy",&local_25b);
              std::__cxx11::string::string(local_1b0,"xyz",&local_25c);
              __l_15._M_len = 4;
              __l_15._M_array = &local_210;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_230,__l_15,&local_259);
              local_248[0] = -1;
              local_248[1] = -1;
              local_248[2] = -1;
              local_248[3] = -1;
              __l_16._M_len = 4;
              __l_16._M_array = local_248;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_190,__l_16,&local_25d);
              Lattice::addFace(local_250,vertexIndex,(int)local_258,&local_230,(vint *)&local_190);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_230);
              lVar5 = 0x60;
              do {
                std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5))
                ;
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != -0x20);
              goto LAB_001232f3;
            }
            if (uVar3 == uVar2) {
              std::__cxx11::string::string((string *)&local_210,"xz",&local_25a);
              std::__cxx11::string::string(local_1f0,"yz",&local_211);
              std::__cxx11::string::string(local_1d0,"yz",&local_25b);
              std::__cxx11::string::string(local_1b0,"xz",&local_25c);
              __l_21._M_len = 4;
              __l_21._M_array = &local_210;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_230,__l_21,&local_259);
              local_248[0] = 1;
              local_248[1] = -1;
              local_248[2] = -1;
              local_248[3] = 1;
              __l_22._M_len = 4;
              __l_22._M_array = local_248;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_190,__l_22,&local_25d);
              Lattice::addFace(local_250,vertexIndex,(int)local_258,&local_230,(vint *)&local_190);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_230);
              lVar5 = 0x60;
              do {
                std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5))
                ;
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != -0x20);
              std::__cxx11::string::string((string *)&local_210,"xy",&local_25a);
              std::__cxx11::string::string(local_1f0,"xz",&local_211);
              std::__cxx11::string::string(local_1d0,"xz",&local_25b);
              std::__cxx11::string::string(local_1b0,"xy",&local_25c);
              __l_23._M_len = 4;
              __l_23._M_array = &local_210;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_230,__l_23,&local_259);
              local_248[0] = -1;
              local_248[1] = 1;
              local_248[2] = 1;
              local_248[3] = -1;
              __l_24._M_len = 4;
              __l_24._M_array = local_248;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_190,__l_24,&local_25d);
              Lattice::addFace(local_250,vertexIndex,(int)local_258 + 1,&local_230,
                               (vint *)&local_190);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_230);
              lVar5 = 0x60;
              do {
                std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5))
                ;
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != -0x20);
              std::__cxx11::string::string((string *)&local_210,"xyz",&local_25a);
              std::__cxx11::string::string(local_1f0,"yz",&local_211);
              std::__cxx11::string::string(local_1d0,"yz",&local_25b);
              std::__cxx11::string::string(local_1b0,"xyz",&local_25c);
              __l_25._M_len = 4;
              __l_25._M_array = &local_210;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_230,__l_25,&local_259);
              local_248[0] = -1;
              local_248[1] = -1;
              local_248[2] = -1;
              local_248[3] = -1;
              __l_26._M_len = 4;
              __l_26._M_array = local_248;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_190,__l_26,&local_25d);
              Lattice::addFace(local_250,vertexIndex,(int)local_258 + 2,&local_230,
                               (vint *)&local_190);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_230);
              lVar5 = 0x60;
              do {
                std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5))
                ;
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != -0x20);
              goto LAB_001235c6;
            }
            iVar4 = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 2
                         );
            if ((uVar2 & 0x80000001) == 1 && iVar4 == 0) {
              std::__cxx11::string::string((string *)&local_210,"xz",&local_25a);
              std::__cxx11::string::string(local_1f0,"xy",&local_211);
              std::__cxx11::string::string(local_1d0,"xy",&local_25b);
              std::__cxx11::string::string(local_1b0,"xz",&local_25c);
              __l_43._M_len = 4;
              __l_43._M_array = &local_210;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_230,__l_43,&local_259);
              local_248[0] = 1;
              local_248[1] = -1;
              local_248[2] = -1;
              local_248[3] = 1;
              __l_44._M_len = 4;
              __l_44._M_array = local_248;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_190,__l_44,&local_25d);
              Lattice::addFace(local_250,vertexIndex,(int)local_258,&local_230,(vint *)&local_190);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_230);
              lVar5 = 0x60;
              do {
                std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5))
                ;
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != -0x20);
              std::__cxx11::string::string((string *)&local_210,"xyz",&local_25a);
              std::__cxx11::string::string(local_1f0,"yz",&local_211);
              std::__cxx11::string::string(local_1d0,"yz",&local_25b);
              std::__cxx11::string::string(local_1b0,"xyz",&local_25c);
              __l_45._M_len = 4;
              __l_45._M_array = &local_210;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_230,__l_45,&local_259);
              local_248[0] = -1;
              local_248[1] = -1;
              local_248[2] = -1;
              local_248[3] = -1;
              __l_46._M_len = 4;
              __l_46._M_array = local_248;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_190,__l_46,&local_25d);
              Lattice::addFace(local_250,vertexIndex,(int)local_258 + 1,&local_230,
                               (vint *)&local_190);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_230);
              lVar5 = 0x60;
              do {
                std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5))
                ;
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != -0x20);
              std::__cxx11::string::string((string *)&local_210,"xyz",&local_25a);
              std::__cxx11::string::string(local_1f0,"yz",&local_211);
              std::__cxx11::string::string(local_1d0,"yz",&local_25b);
              std::__cxx11::string::string(local_1b0,"xyz",&local_25c);
              __l_47._M_len = 4;
              __l_47._M_array = &local_210;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_230,__l_47,&local_259);
              local_248[0] = 1;
              local_248[1] = 1;
              local_248[2] = 1;
              local_248[3] = 1;
              __l_48._M_len = 4;
              __l_48._M_array = local_248;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_190,__l_48,&local_25d);
              Lattice::addFace(local_250,vertexIndex,(int)local_258 + 2,&local_230,
                               (vint *)&local_190);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_230);
              lVar5 = 0x60;
              do {
                std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5))
                ;
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != -0x20);
              std::__cxx11::string::string((string *)&local_210,"xz",&local_25a);
              std::__cxx11::string::string(local_1f0,"xy",&local_211);
              std::__cxx11::string::string(local_1d0,"xy",&local_25b);
              std::__cxx11::string::string(local_1b0,"xz",&local_25c);
              __l_49._M_len = 4;
              __l_49._M_array = &local_210;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_230,__l_49,&local_259);
              local_248[0] = -1;
              local_248[1] = 1;
              local_248[2] = 1;
              local_248[3] = -1;
              __l_50._M_len = 4;
              __l_50._M_array = local_248;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_190,__l_50,&local_25d);
              Lattice::addFace(local_250,vertexIndex,(int)local_258 + 3,&local_230,
                               (vint *)&local_190);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_230);
              lVar5 = 0x60;
              do {
                std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5))
                ;
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != -0x20);
              std::__cxx11::string::string((string *)&local_210,"xz",&local_25a);
              std::__cxx11::string::string(local_1f0,"yz",&local_211);
              std::__cxx11::string::string(local_1d0,"yz",&local_25b);
              std::__cxx11::string::string(local_1b0,"xz",&local_25c);
              __l_51._M_len = 4;
              __l_51._M_array = &local_210;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_230,__l_51,&local_259);
              local_248[0] = 1;
              local_248[1] = -1;
              local_248[2] = -1;
              local_248[3] = 1;
              __l_52._M_len = 4;
              __l_52._M_array = local_248;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_190,__l_52,&local_25d);
              Lattice::addFace(local_250,vertexIndex,(int)local_258 + 4,&local_230,
                               (vint *)&local_190);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_230);
              lVar5 = 0x60;
              do {
                std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5))
                ;
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != -0x20);
              std::__cxx11::string::string((string *)&local_210,"xz",&local_25a);
              std::__cxx11::string::string(local_1f0,"yz",&local_211);
              std::__cxx11::string::string(local_1d0,"yz",&local_25b);
              std::__cxx11::string::string(local_1b0,"xz",&local_25c);
              __l_53._M_len = 4;
              __l_53._M_array = &local_210;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_230,__l_53,&local_259);
              local_248[0] = -1;
              local_248[1] = 1;
              local_248[2] = 1;
              local_248[3] = -1;
              __l_54._M_len = 4;
              __l_54._M_array = local_248;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_190,__l_54,&local_25d);
              Lattice::addFace(local_250,vertexIndex,(int)local_258 + 5,&local_230,
                               (vint *)&local_190);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_230);
              lVar5 = 0x60;
              do {
                std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5))
                ;
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != -0x20);
            }
            else {
              if (((undefined1  [16])cVar9 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0
                  || iVar4 != 1) goto LAB_00124e65;
              std::__cxx11::string::string((string *)&local_210,"xyz",&local_25a);
              std::__cxx11::string::string(local_1f0,"yz",&local_211);
              std::__cxx11::string::string(local_1d0,"yz",&local_25b);
              std::__cxx11::string::string(local_1b0,"xyz",&local_25c);
              __l_55._M_len = 4;
              __l_55._M_array = &local_210;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_230,__l_55,&local_259);
              local_248[0] = 1;
              local_248[1] = 1;
              local_248[2] = 1;
              local_248[3] = 1;
              __l_56._M_len = 4;
              __l_56._M_array = local_248;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_190,__l_56,&local_25d);
              Lattice::addFace(local_250,vertexIndex,(int)local_258,&local_230,(vint *)&local_190);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_230);
              lVar5 = 0x60;
              do {
                std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5))
                ;
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != -0x20);
              std::__cxx11::string::string((string *)&local_210,"xz",&local_25a);
              std::__cxx11::string::string(local_1f0,"xy",&local_211);
              std::__cxx11::string::string(local_1d0,"xy",&local_25b);
              std::__cxx11::string::string(local_1b0,"xz",&local_25c);
              __l_57._M_len = 4;
              __l_57._M_array = &local_210;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_230,__l_57,&local_259);
              local_248[0] = -1;
              local_248[1] = 1;
              local_248[2] = 1;
              local_248[3] = -1;
              __l_58._M_len = 4;
              __l_58._M_array = local_248;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_190,__l_58,&local_25d);
              Lattice::addFace(local_250,vertexIndex,(int)local_258 + 1,&local_230,
                               (vint *)&local_190);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_230);
              lVar5 = 0x60;
              do {
                std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5))
                ;
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != -0x20);
              std::__cxx11::string::string((string *)&local_210,"xz",&local_25a);
              std::__cxx11::string::string(local_1f0,"xy",&local_211);
              std::__cxx11::string::string(local_1d0,"xy",&local_25b);
              std::__cxx11::string::string(local_1b0,"xz",&local_25c);
              __l_59._M_len = 4;
              __l_59._M_array = &local_210;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_230,__l_59,&local_259);
              local_248[0] = 1;
              local_248[1] = -1;
              local_248[2] = -1;
              local_248[3] = 1;
              __l_60._M_len = 4;
              __l_60._M_array = local_248;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_190,__l_60,&local_25d);
              Lattice::addFace(local_250,vertexIndex,(int)local_258 + 2,&local_230,
                               (vint *)&local_190);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_230);
              lVar5 = 0x60;
              do {
                std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5))
                ;
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != -0x20);
              std::__cxx11::string::string((string *)&local_210,"xyz",&local_25a);
              std::__cxx11::string::string(local_1f0,"yz",&local_211);
              std::__cxx11::string::string(local_1d0,"yz",&local_25b);
              std::__cxx11::string::string(local_1b0,"xyz",&local_25c);
              __l_61._M_len = 4;
              __l_61._M_array = &local_210;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_230,__l_61,&local_259);
              local_248[0] = -1;
              local_248[1] = -1;
              local_248[2] = -1;
              local_248[3] = -1;
              __l_62._M_len = 4;
              __l_62._M_array = local_248;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_190,__l_62,&local_25d);
              Lattice::addFace(local_250,vertexIndex,(int)local_258 + 3,&local_230,
                               (vint *)&local_190);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_230);
              lVar5 = 0x60;
              do {
                std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5))
                ;
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != -0x20);
              std::__cxx11::string::string((string *)&local_210,"xyz",&local_25a);
              std::__cxx11::string::string(local_1f0,"xy",&local_211);
              std::__cxx11::string::string(local_1d0,"xy",&local_25b);
              std::__cxx11::string::string(local_1b0,"xyz",&local_25c);
              __l_63._M_len = 4;
              __l_63._M_array = &local_210;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_230,__l_63,&local_259);
              local_248[0] = 1;
              local_248[1] = 1;
              local_248[2] = 1;
              local_248[3] = 1;
              __l_64._M_len = 4;
              __l_64._M_array = local_248;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_190,__l_64,&local_25d);
              Lattice::addFace(local_250,vertexIndex,(int)local_258 + 4,&local_230,
                               (vint *)&local_190);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_230);
              lVar5 = 0x60;
              do {
                std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5))
                ;
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != -0x20);
              std::__cxx11::string::string((string *)&local_210,"xyz",&local_25a);
              std::__cxx11::string::string(local_1f0,"xy",&local_211);
              std::__cxx11::string::string(local_1d0,"xy",&local_25b);
              std::__cxx11::string::string(local_1b0,"xyz",&local_25c);
              __l_65._M_len = 4;
              __l_65._M_array = &local_210;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_230,__l_65,&local_259);
              local_248[0] = -1;
              local_248[1] = -1;
              local_248[2] = -1;
              local_248[3] = -1;
              __l_66._M_len = 4;
              __l_66._M_array = local_248;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_190,__l_66,&local_25d);
              Lattice::addFace(local_250,vertexIndex,(int)local_258 + 5,&local_230,
                               (vint *)&local_190);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_190);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_230);
              lVar5 = 0x60;
              do {
                std::__cxx11::string::~string((string *)((long)&local_210._M_dataplus._M_p + lVar5))
                ;
                lVar5 = lVar5 + -0x20;
              } while (lVar5 != -0x20);
            }
            local_258 = (ulong)((int)local_258 + 6);
          }
        }
      }
    }
LAB_00124e65:
    vertexIndex = vertexIndex + 1;
  } while( true );
}

Assistant:

void RhombicLattice::createFaces()
{
    int faceIndex = 0;
    for (int vertexIndex = 0; vertexIndex < pow(l, 3); ++vertexIndex)
    {
        cartesian4 coordinate = indexToCoordinate(vertexIndex);
        if ((coordinate.x + coordinate.y + coordinate.z) % 2 == 1)
        {
            if (coordinate.z == 0)
            {
                continue;
            }
            else if (coordinate.z % 2 == 1)
            {
                if (coordinate.y == 0)
                {
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                }
                else if (coordinate.x == 0)
                {
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    if (coordinate.z != l - 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {1, 1, 1, 1});
                        ++faceIndex;
                    }
                    if (coordinate.z != 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {1, -1, -1, 1});
                        ++faceIndex;
                    }
                }
                else if (coordinate.x == l - 1)
                {
                    if (coordinate.y == l - 1)
                    {
                        continue;
                    }
                    addFace(vertexIndex, faceIndex, {"yz", "xz", "xz", "yz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    if (coordinate.z != l - 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {-1, 1, 1, -1});
                        ++faceIndex;
                    }
                    if (coordinate.z != 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {-1, -1, -1, -1});
                        ++faceIndex;
                    }
                }
                else if (coordinate.y == l - 1)
                {
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                }
                else if (coordinate.x % 2 == 0 && coordinate.y % 2 == 0)
                {
                    if (coordinate.z != l - 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {1, 1, 1, 1});
                        ++faceIndex;
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {-1, 1, 1, -1});
                        ++faceIndex;
                    }
                    if (coordinate.z != 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {1, -1, -1, 1});
                        ++faceIndex;
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {-1, -1, -1, -1});
                        ++faceIndex;
                    }
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                }
                else if (coordinate.x % 2 == 1 && coordinate.y % 2 == 1)
                {
                    if (coordinate.z != l - 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {1, 1, 1, 1});
                        ++faceIndex;
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {-1, 1, 1, -1});
                        ++faceIndex;
                    }
                    if (coordinate.z != 1)
                    {
                        addFace(vertexIndex, faceIndex, {"xy", "yz", "yz", "xy"}, {1, -1, -1, 1});
                        ++faceIndex;
                        addFace(vertexIndex, faceIndex, {"xyz", "xz", "xz", "xyz"}, {-1, -1, -1, -1});
                        ++faceIndex;
                    }
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {-1, 1, 1, -1});
                    ++faceIndex;
                }
            }
            else
            {
                if (coordinate.x == 0)
                {
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                }
                else if (coordinate.y == 0)
                {
                    if (coordinate.x == l - 1)
                    {
                        continue;
                    }
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xy", "xz", "xz", "xy"}, {1, -1, -1, 1});
                    ++faceIndex;
                }
                else if (coordinate.x == l - 1)
                {
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                }
                else if (coordinate.y == l - 1)
                {
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xy", "xz", "xz", "xy"}, {-1, 1, 1, -1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                }
                else if (coordinate.x % 2 == 0 && coordinate.y % 2 == 1)
                {
                    addFace(vertexIndex, faceIndex, {"xz", "xy", "xy", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "xy", "xy", "xz"}, {-1, 1, 1, -1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "yz", "yz", "xz"}, {-1, 1, 1, -1});
                    ++faceIndex;
                }
                else if (coordinate.x % 2 == 1 && coordinate.y % 2 == 0)
                {
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "xy", "xy", "xz"}, {-1, 1, 1, -1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xz", "xy", "xy", "xz"}, {1, -1, -1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "yz", "yz", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {1, 1, 1, 1});
                    ++faceIndex;
                    addFace(vertexIndex, faceIndex, {"xyz", "xy", "xy", "xyz"}, {-1, -1, -1, -1});
                    ++faceIndex;
                }
            }
        }
    }
}